

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_mp3_init_memory(void *pData,size_t dataSize,ma_decoding_backend_config *pConfig,
                            ma_allocation_callbacks *pAllocationCallbacks,ma_mp3 *pMP3)

{
  ma_bool32 mVar1;
  ma_mp3 *in_RCX;
  ma_mp3 *in_RDX;
  ma_decoding_backend_config *in_RSI;
  ma_decoding_backend_config *in_R8;
  ma_bool32 mp3Result;
  ma_result result;
  uint in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  local_4 = ma_mp3_init_internal(in_RSI,in_RDX);
  if (local_4 == MA_SUCCESS) {
    mVar1 = ma_dr_mp3_init_memory
                      ((ma_dr_mp3 *)in_RCX,in_R8,(ulong)in_stack_ffffffffffffffc8,
                       (ma_allocation_callbacks *)0x24231e);
    if (mVar1 == 1) {
      ma_mp3_post_init(in_RCX,in_R8,(ma_allocation_callbacks *)CONCAT44(local_4,1));
      local_4 = MA_SUCCESS;
    }
    else {
      local_4 = MA_INVALID_FILE;
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_mp3_init_memory(const void* pData, size_t dataSize, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_mp3* pMP3)
{
    ma_result result;

    result = ma_mp3_init_internal(pConfig, pMP3);
    if (result != MA_SUCCESS) {
        return result;
    }

    #if !defined(MA_NO_MP3)
    {
        ma_bool32 mp3Result;

        mp3Result = ma_dr_mp3_init_memory(&pMP3->dr, pData, dataSize, pAllocationCallbacks);
        if (mp3Result != MA_TRUE) {
            return MA_INVALID_FILE;
        }

        ma_mp3_post_init(pMP3, pConfig, pAllocationCallbacks);

        return MA_SUCCESS;
    }
    #else
    {
        /* mp3 is disabled. */
        (void)pData;
        (void)dataSize;
        (void)pAllocationCallbacks;
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}